

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_signature_algorithms(ptls_verify_certificate_t *vc,ptls_buffer_t *sendbuf)

{
  ushort uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  uint16_t *puVar7;
  
  iVar5 = ptls_buffer_reserve(sendbuf,2);
  if (iVar5 == 0) {
    puVar2 = sendbuf->base;
    sVar3 = sendbuf->off;
    (puVar2 + sVar3)[0] = '\0';
    (puVar2 + sVar3)[1] = '\0';
    sVar4 = sendbuf->off;
    sVar3 = sVar4 + 2;
    sendbuf->off = sVar3;
    if (vc == (ptls_verify_certificate_t *)0x0) {
      puVar7 = push_signature_algorithms::default_algos;
    }
    else {
      puVar7 = vc->algos;
    }
    uVar1 = *puVar7;
    sVar6 = sVar3;
    while (uVar1 != 0xffff) {
      puVar7 = puVar7 + 1;
      iVar5 = ptls_buffer_reserve(sendbuf,2);
      if (iVar5 != 0) {
        return iVar5;
      }
      *(ushort *)(sendbuf->base + sendbuf->off) = uVar1 << 8 | uVar1 >> 8;
      sVar6 = sendbuf->off + 2;
      sendbuf->off = sVar6;
      uVar1 = *puVar7;
    }
    sendbuf->base[sVar4] = (uint8_t)(sVar6 - sVar3 >> 8);
    sendbuf->base[sVar4 + 1] = (uint8_t)(sVar6 - sVar3);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int push_signature_algorithms(ptls_verify_certificate_t *vc, ptls_buffer_t *sendbuf)
{
    /* The list sent when verify callback is not registered */
    static const uint16_t default_algos[] = {PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256,
                                             PTLS_SIGNATURE_RSA_PKCS1_SHA256, PTLS_SIGNATURE_RSA_PKCS1_SHA1, UINT16_MAX};
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        for (const uint16_t *p = vc != NULL ? vc->algos : default_algos; *p != UINT16_MAX; ++p)
            ptls_buffer_push16(sendbuf, *p);
    });

    ret = 0;
Exit:
    return ret;
}